

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::preprocessChildren(TraverseSchema *this,DOMElement *root)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *name;
  DOMNode *local_30;
  DOMElement *child;
  NamespaceScopeManager nsMgr;
  DOMElement *root_local;
  TraverseSchema *this_local;
  XMLCh *str1;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)root;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&child,root,this->fSchemaInfo,this);
  for (local_30 = &XUtil::getFirstChildElement((DOMNode *)nsMgr.fSchemaInfo)->super_DOMNode;
      local_30 != (DOMNode *)0x0; local_30 = &XUtil::getNextSiblingElement(local_30)->super_DOMNode)
  {
    iVar2 = (*local_30->_vptr_DOMNode[0x18])();
    str1 = (XMLCh *)CONCAT44(extraout_var,iVar2);
    bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
    if (!bVar1) {
      bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_INCLUDE);
      if (bVar1) {
        preprocessInclude(this,(DOMElement *)local_30);
      }
      else {
        bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_IMPORT);
        if (bVar1) {
          preprocessImport(this,(DOMElement *)local_30);
        }
        else {
          bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_REDEFINE);
          if (!bVar1) break;
          preprocessRedefine(this,(DOMElement *)local_30);
        }
      }
    }
  }
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&child);
  return;
}

Assistant:

void TraverseSchema::preprocessChildren(const DOMElement* const root) {

    NamespaceScopeManager nsMgr(root, fSchemaInfo, this);

    // process <redefine>, <include> and <import> info items.
    DOMElement* child = XUtil::getFirstChildElement(root);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* name = child->getLocalName();

        if (XMLString::equals(name, SchemaSymbols::fgELT_ANNOTATION)) {
            continue;
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_INCLUDE)) {
            preprocessInclude(child);
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_IMPORT)) {
            preprocessImport(child);
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_REDEFINE)) {
            preprocessRedefine(child);
        }
        else
            break;
    }
}